

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

uint64_t __thiscall
nivalis::Environment::def_func
          (Environment *this,string *func_name,Expr *expr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *arg_bindings)

{
  uint uVar1;
  pointer pUVar2;
  pointer puVar3;
  unsigned_long uVar4;
  iterator __position;
  pointer puVar5;
  bool bVar6;
  iterator iVar7;
  mapped_type_conflict1 *pmVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  unsigned_long uVar13;
  ulong uVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  Expr func_expr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arg_vars;
  uint64_t local_b8;
  Expr local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  ASTNode local_90;
  long local_80;
  long lStack_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->error_msg)._M_string_length = 0;
  *(this->error_msg)._M_dataplus._M_p = '\0';
  local_98 = arg_bindings;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->freg)._M_t,func_name);
  local_58 = func_name;
  if ((_Rb_tree_header *)iVar7._M_node == &(this->freg)._M_t._M_impl.super__Rb_tree_header) {
    local_b8 = ((long)(this->funcs).
                      super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->funcs).
                      super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->freg,func_name);
    *pmVar8 = local_b8;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::emplace_back<>(&this->funcs);
    std::__cxx11::string::_M_assign
              ((string *)
               ((this->funcs).
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
  }
  else {
    local_b8 = *(uint64_t *)(iVar7._M_node + 2);
  }
  pUVar2 = (this->funcs).
           super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(pointer *)
            &pUVar2[local_b8].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl;
  if (*(pointer *)
       ((long)&pUVar2[local_b8].deps.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
      puVar3) {
    *(pointer *)
     ((long)&pUVar2[local_b8].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl + 8) = puVar3;
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_b0.ast,&expr->ast);
  Expr::optimize(&local_b0,5);
  local_90._0_8_ = (long *)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70,
             (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict1 *)&local_90,
             (allocator_type *)&local_50);
  puVar3 = (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 3;
    uVar13 = 0;
    do {
      uVar4 = puVar3[uVar13];
      if (uVar4 != 0xffffffffffffffff) {
        local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = uVar13;
      }
      uVar13 = uVar13 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != uVar13);
  }
  this_00 = &pUVar2[local_b8].deps;
  if (local_b0.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b0.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar11 = 8;
    uVar14 = 0;
    do {
      uVar1 = *(uint *)((long)local_b0.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
      if ((((uVar1 != 3) && (uVar1 < 0x13)) && ((0x1fff3U >> ((byte)uVar1 & 0x1f) & 1) == 0)) &&
         (uVar13 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [*(long *)((long)&(local_b0.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar11)],
         uVar13 != 0xffffffffffffffff)) {
        *(undefined4 *)
         ((long)local_b0.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar11 + -8) = 3;
        *(unsigned_long *)
         ((long)&(local_b0.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar11) = uVar13;
      }
      if (*(int *)((long)local_b0.ast.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) == 0xc) {
        local_90._0_8_ =
             ZEXT48(*(uint *)((long)&(local_b0.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar11));
        __position._M_current =
             *(pointer *)
              ((long)&pUVar2[local_b8].deps.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (__position._M_current ==
            *(pointer *)
             ((long)&pUVar2[local_b8].deps.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(this_00,__position,(unsigned_long *)&local_90);
        }
        else {
          *__position._M_current = local_90._0_8_;
          *(unsigned_long **)
           ((long)&pUVar2[local_b8].deps.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               __position._M_current + 1;
        }
      }
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar14 < (ulong)((long)local_b0.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b0.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  puVar3 = pUVar2[local_b8].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = *(pointer *)
            ((long)&pUVar2[local_b8].deps.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
  if (puVar3 != puVar5) {
    uVar14 = (long)puVar5 - (long)puVar3 >> 3;
    lVar11 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar5,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar5);
  }
  _Var9 = std::
          __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pUVar2[local_b8].deps.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     *(pointer *)
                      ((long)&pUVar2[local_b8].deps.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(long)_Var9._M_current -
                     (long)(this_00->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  pUVar2[local_b8].n_args =
       (long)(local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
            (&pUVar2[local_b8].expr.ast,&local_b0);
  bVar6 = anon_unknown_0::check_for_cycle(&this->funcs,local_b8);
  if (bVar6) {
    Expr::ASTNode::ASTNode(&local_90,null);
    std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
    _M_assign_aux<nivalis::Expr::ASTNode_const*>
              ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)
               &pUVar2[local_b8].expr,&local_90,&local_80);
    puVar3 = pUVar2[local_b8].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pUVar2[local_b8].deps.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
        puVar3) {
      *(pointer *)
       ((long)&pUVar2[local_b8].deps.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
           puVar3;
    }
    std::operator+(&local_50,"Cycle found in definition of ",local_58);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_80 = *plVar12;
      lStack_78 = plVar10[3];
      local_90._0_8_ = &local_80;
    }
    else {
      local_80 = *plVar12;
      local_90._0_8_ = (long *)*plVar10;
    }
    local_90.field_1 = *(anon_union_8_3_343d95dd_for_ASTNode_1 *)(plVar10 + 1);
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->error_msg,(string *)&local_90);
    if ((long *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_b8 = 0xffffffffffffffff;
  }
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_b8;
}

Assistant:

uint64_t Environment::def_func(const std::string& func_name,
                  const Expr& expr,
                  const std::vector<uint64_t>& arg_bindings) {
    error_msg.clear();
    size_t idx = 0;
    auto it = freg.find(func_name);
    if (it == freg.end()) {
        // New function
        idx = freg[func_name] = funcs.size();
        funcs.emplace_back();
        funcs.back().name = func_name;
    } else {
        idx = it->second;
    }
    UserFunction& func = funcs[idx];
    func.deps.clear();
    Expr func_expr = expr;
    func_expr.optimize(); // Optimize function expression
    auto& ast = func_expr.ast;
    // Invert argument mapping
    std::vector<uint64_t> arg_vars(vars.size(), -1);
    for (size_t i = 0; i < arg_bindings.size(); ++i) {
        if (~arg_bindings[i]) {
            arg_vars[arg_bindings[i]] = i;
        }
    }
    // Sub arguments
    for (size_t i = 0; i < ast.size(); ++i) {
        auto& nd = ast[i];
        if (OpCode::has_ref(nd.opcode) &&
            nd.opcode != OpCode::arg &&
            ~arg_vars[nd.ref]) {
            // Set argument
            nd.opcode = OpCode::arg;
            nd.ref = arg_vars[nd.ref];
        }
        if (nd.opcode == OpCode::call) {
            // Set dependency on other function
            func.deps.push_back(nd.call_info[0]);
        }
    }
    std::sort(func.deps.begin(), func.deps.end());
    func.deps.resize(std::unique(func.deps.begin(), func.deps.end()) - func.deps.begin());
    func.n_args = arg_bindings.size();
    func.expr = std::move(func_expr);

    // Check for recursion
    if (check_for_cycle(funcs, idx)) {
        // Found cycle
        func.expr.ast = { OpCode::null };
        func.deps.clear();
        error_msg = "Cycle found in definition of " + func_name + "(...)\n";
        return -1;
    }
    return idx;
}